

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O3

void player_learn_curse(player *p,curse *curse)

{
  wchar_t wVar1;
  int *piVar2;
  size_t sVar3;
  
  wVar1 = lookup_curse(curse->name);
  if (rune_max != 0) {
    piVar2 = &rune_list->index;
    sVar3 = 0;
    do {
      if ((((rune *)(piVar2 + -1))->variety == RUNE_VAR_CURSE) && (*piVar2 == wVar1)) {
        if (-1 < (int)(uint)sVar3) {
          player_learn_rune(p,(ulong)((uint)sVar3 & 0x7fffffff),true);
        }
        break;
      }
      sVar3 = sVar3 + 1;
      piVar2 = piVar2 + 6;
    } while (rune_max != sVar3);
  }
  update_player_object_knowledge(p);
  return;
}

Assistant:

void player_learn_curse(struct player *p, struct curse *curse)
{
	int index = rune_index(RUNE_VAR_CURSE, lookup_curse(curse->name));
	if (index >= 0) {
		player_learn_rune(p, index, true);
	}
	update_player_object_knowledge(p);
}